

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void replmon(monst *mtmp,monst *mtmp2)

{
  xchar x;
  xchar y;
  level *lev;
  int iVar1;
  char *pcVar2;
  uint local_34;
  obj *local_20;
  obj *otmp;
  monst *mtmp2_local;
  monst *mtmp_local;
  
  for (local_20 = mtmp2->minvent; local_20 != (obj *)0x0; local_20 = local_20->nobj) {
    (local_20->v).v_ocarry = mtmp2;
  }
  mtmp->minvent = (obj *)0x0;
  relmon(mtmp);
  if (mtmp != u.usteed) {
    place_monster(mtmp2,(int)mtmp2->mx,(int)mtmp2->my);
  }
  if (mtmp2->wormno != '\0') {
    place_wsegs(mtmp2);
  }
  if ((((mtmp2->data->mlet != '\x19') && (mtmp2->data != mons + 0x20)) &&
      (mtmp2->data != mons + 0x21)) && (mtmp2->data != mons + 0x101)) {
    pcVar2 = mons_mname(mtmp2->data);
    iVar1 = strcmp(pcVar2,"gold dragon");
    if (iVar1 != 0) {
      pcVar2 = mons_mname(mtmp2->data);
      iVar1 = strcmp(pcVar2,"baby gold dragon");
      if (((iVar1 != 0) && (mtmp2->data != mons + 0x73)) && (mtmp2->data != mons + 0xa0))
      goto LAB_0024a5f8;
    }
  }
  lev = mtmp2->dlevel;
  x = mtmp2->mx;
  y = mtmp2->my;
  if (((mtmp2->data->mlet == '\x19') || (mtmp2->data == mons + 0x20)) ||
     ((mtmp2->data == mons + 0x21 || (mtmp2->data == mons + 0x101)))) {
LAB_0024a590:
    local_34 = 1;
  }
  else {
    pcVar2 = mons_mname(mtmp2->data);
    iVar1 = strcmp(pcVar2,"gold dragon");
    if (iVar1 == 0) goto LAB_0024a590;
    pcVar2 = mons_mname(mtmp2->data);
    iVar1 = strcmp(pcVar2,"baby gold dragon");
    if ((iVar1 == 0) || (mtmp2->data == mons + 0x73)) goto LAB_0024a590;
    local_34 = (uint)(mtmp2->data == mons + 0xa0);
  }
  new_light_source(lev,x,y,local_34,1,mtmp2);
  del_light_source(mtmp->dlevel,1,mtmp);
LAB_0024a5f8:
  mtmp2->nmon = mtmp2->dlevel->monlist;
  mtmp2->dlevel->monlist = mtmp2;
  if (u.ustuck == mtmp) {
    u.ustuck = mtmp2;
  }
  if (u.usteed == mtmp) {
    u.usteed = mtmp2;
  }
  if ((*(uint *)&mtmp2->field_0x60 >> 0x19 & 1) != 0) {
    replshk(mtmp,mtmp2);
  }
  free(mtmp);
  return;
}

Assistant:

void replmon(struct monst *mtmp, struct monst *mtmp2)
{
    struct obj *otmp;

    /* transfer the monster's inventory */
    for (otmp = mtmp2->minvent; otmp; otmp = otmp->nobj)
	otmp->ocarry = mtmp2;

    mtmp->minvent = 0;

    /* remove the old monster from the map and from `level->monlist' list */
    relmon(mtmp);

    /* finish adding its replacement */
    if (mtmp != u.usteed)	/* don't place steed onto the map */
	place_monster(mtmp2, mtmp2->mx, mtmp2->my);
    if (mtmp2->wormno)	    /* update level->monsters[wseg->wx][wseg->wy] */
	place_wsegs(mtmp2); /* locations to mtmp2 not mtmp. */
    if (emits_light(mtmp2->data)) {
	/* since this is so rare, we don't have any `mon_move_light_source' */
	new_light_source(mtmp2->dlevel, mtmp2->mx, mtmp2->my,
			 emits_light(mtmp2->data),
			 LS_MONSTER, mtmp2);
	/* here we rely on the fact that `mtmp' hasn't actually been deleted */
	del_light_source(mtmp->dlevel, LS_MONSTER, mtmp);
    }
    mtmp2->nmon = mtmp2->dlevel->monlist;
    mtmp2->dlevel->monlist = mtmp2;
    if (u.ustuck == mtmp) u.ustuck = mtmp2;
    if (u.usteed == mtmp) u.usteed = mtmp2;
    if (mtmp2->isshk) replshk(mtmp,mtmp2);

    /* discard the old monster */
    dealloc_monst(mtmp);
}